

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int GetConfRPLIDAR(RPLIDAR *pRPLIDAR,int type,uchar *payload,int payloadsize,uchar *resppayload,
                  int resppayloadsize)

{
  uchar uVar1;
  int iVar2;
  int local_d4 [2];
  int DataType;
  int SendMode;
  int DataResponseLength;
  uchar reqbuf [136];
  int resppayloadsize_local;
  uchar *resppayload_local;
  int payloadsize_local;
  uchar *payload_local;
  int type_local;
  RPLIDAR *pRPLIDAR_local;
  
  DataType = 0;
  local_d4[1] = 0;
  local_d4[0] = 0;
  reqbuf._132_4_ = resppayloadsize;
  if ((payloadsize < 0) || (0x80 < payloadsize)) {
    printf("Error writing data to a RPLIDAR : Invalid payloadsize. \n");
    pRPLIDAR_local._4_4_ = 1;
  }
  else {
    memset(&SendMode,0,0x88);
    SendMode._0_1_ = 0xa5;
    SendMode._1_1_ = 0x84;
    SendMode._2_1_ = (char)payloadsize + '\x04';
    unique0x100001bc = type;
    if (0 < payloadsize) {
      memcpy((void *)((long)&DataResponseLength + 3),payload,(long)payloadsize);
    }
    uVar1 = ComputeChecksumRPLIDAR((uchar *)&SendMode,payloadsize + 8);
    *(uchar *)((long)&SendMode + (long)(payloadsize + 7)) = uVar1;
    iVar2 = WriteAllRS232Port(&pRPLIDAR->RS232Port,(uint8 *)&SendMode,payloadsize + 8);
    if (iVar2 == 0) {
      iVar2 = GetResponseDescriptorRPLIDAR(pRPLIDAR,&DataType,local_d4 + 1,local_d4);
      if (iVar2 == 0) {
        if (local_d4[0] == 0x20) {
          if ((int)reqbuf._132_4_ < DataType) {
            printf("Error writing data to a RPLIDAR : Invalid resppayloadsize. \n");
            pRPLIDAR_local._4_4_ = 1;
          }
          else {
            memset(resppayload,0,(long)DataType);
            iVar2 = ReadAllRS232Port(&pRPLIDAR->RS232Port,resppayload,DataType);
            if (iVar2 == 0) {
              pRPLIDAR_local._4_4_ = 0;
            }
            else {
              printf("A RPLIDAR is not responding correctly. \n");
              pRPLIDAR_local._4_4_ = 1;
            }
          }
        }
        else {
          printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
          pRPLIDAR_local._4_4_ = 1;
        }
      }
      else {
        pRPLIDAR_local._4_4_ = 1;
      }
    }
    else {
      printf("Error writing data to a RPLIDAR. \n");
      pRPLIDAR_local._4_4_ = 1;
    }
  }
  return pRPLIDAR_local._4_4_;
}

Assistant:

inline int GetConfRPLIDAR(RPLIDAR* pRPLIDAR, int type, unsigned char* payload, int payloadsize, unsigned char* resppayload, int resppayloadsize)
{
	unsigned char reqbuf[136];
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	if ((payloadsize < 0)||(payloadsize > 128))
	{
		printf("Error writing data to a RPLIDAR : Invalid payloadsize. \n");
		return EXIT_FAILURE;
	}

	memset(reqbuf, 0, sizeof(reqbuf));
	reqbuf[0] = START_FLAG1_RPLIDAR;
	reqbuf[1] = GET_LIDAR_CONF_REQUEST_RPLIDAR;
	reqbuf[2] = (unsigned char)(4+payloadsize);
	memcpy(reqbuf+3, (unsigned char*)&type, 4);
	if (payloadsize > 0) memcpy(reqbuf+7, payload, payloadsize);
	reqbuf[7+payloadsize] = ComputeChecksumRPLIDAR(reqbuf, 8+payloadsize);

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, 8+payloadsize) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if (DataType != GET_LIDAR_CONF_RESPONSE_RPLIDAR)
	{
		printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
		return EXIT_FAILURE;
	}

	if (DataResponseLength > resppayloadsize)
	{
		printf("Error writing data to a RPLIDAR : Invalid resppayloadsize. \n");
		return EXIT_FAILURE;
	}

	// Receive the data response.
	memset(resppayload, 0, DataResponseLength);
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, resppayload, DataResponseLength) != EXIT_SUCCESS)
	{
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;
	}
	return EXIT_SUCCESS;
}